

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

Value * __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap
::operator[](InnerMap *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  KeyValuePair kv;
  KeyValuePair KStack_58;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap::iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>,_bool>
  local_30;
  
  std::__cxx11::string::string((string *)&KStack_58,(string *)k);
  KStack_58.v_ = (value_type *)0x0;
  insert(&local_30,this,&KStack_58);
  std::__cxx11::string::~string((string *)&KStack_58);
  return &((local_30.first.node_)->kv).v_;
}

Assistant:

Value& operator[](const Key& k) {
      KeyValuePair kv(k, Value());
      return insert(kv).first->value();
    }